

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O1

int av1_cyclic_refresh_rc_bits_per_mb(AV1_COMP *cpi,int i,double correction_factor)

{
  CYCLIC_REFRESH *pCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  
  pCVar1 = cpi->cyclic_refresh;
  if ((cpi->rc).rtc_external_ratectrl == 0) {
    iVar4 = pCVar1->target_num_seg_blocks + pCVar1->actual_num_seg1_blocks +
            pCVar1->actual_num_seg2_blocks;
  }
  else {
    iVar4 = ((cpi->common).mi_params.mi_rows * pCVar1->percent_refresh *
            (cpi->common).mi_params.mi_cols) / 100 + pCVar1->target_num_seg_blocks;
  }
  dVar5 = (double)(iVar4 >> 1) / (double)((cpi->common).mi_params.MBs << 4);
  iVar2 = compute_deltaq(cpi,i,pCVar1->rate_ratio_qdelta);
  iVar4 = (cpi->sf).hl_sf.accurate_bit_estimate;
  iVar3 = av1_rc_bits_per_mb(cpi,(cpi->common).current_frame.frame_type,i,correction_factor,iVar4);
  iVar4 = av1_rc_bits_per_mb(cpi,(cpi->common).current_frame.frame_type,iVar2 + i,correction_factor,
                             iVar4);
  dVar5 = round((double)iVar4 * dVar5 + (double)iVar3 * (1.0 - dVar5));
  return (int)dVar5;
}

Assistant:

int av1_cyclic_refresh_rc_bits_per_mb(const AV1_COMP *cpi, int i,
                                      double correction_factor) {
  const AV1_COMMON *const cm = &cpi->common;
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  int bits_per_mb;
  int num4x4bl = cm->mi_params.MBs << 4;
  // Weight for segment prior to encoding: take the average of the target
  // number for the frame to be encoded and the actual from the previous frame.
  double weight_segment =
      (double)((cr->target_num_seg_blocks + cr->actual_num_seg1_blocks +
                cr->actual_num_seg2_blocks) >>
               1) /
      num4x4bl;
  if (cpi->rc.rtc_external_ratectrl) {
    weight_segment = (double)((cr->target_num_seg_blocks +
                               cr->percent_refresh * cm->mi_params.mi_rows *
                                   cm->mi_params.mi_cols / 100) >>
                              1) /
                     num4x4bl;
  }
  // Compute delta-q corresponding to qindex i.
  int deltaq = compute_deltaq(cpi, i, cr->rate_ratio_qdelta);
  const int accurate_estimate = cpi->sf.hl_sf.accurate_bit_estimate;
  // Take segment weighted average for bits per mb.
  bits_per_mb = (int)round(
      (1.0 - weight_segment) *
          av1_rc_bits_per_mb(cpi, cm->current_frame.frame_type, i,
                             correction_factor, accurate_estimate) +
      weight_segment * av1_rc_bits_per_mb(cpi, cm->current_frame.frame_type,
                                          i + deltaq, correction_factor,
                                          accurate_estimate));
  return bits_per_mb;
}